

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_rdp_queue.c
# Opt level: O3

void csp_rdp_queue_flush(csp_conn_t *conn)

{
  if (conn != (csp_conn_t *)0x0) {
    __csp_rdp_queue_flush(tx_queue,conn);
    __csp_rdp_queue_flush(rx_queue,conn);
    return;
  }
  csp_queue_empty(tx_queue);
  csp_queue_empty(rx_queue);
  return;
}

Assistant:

void csp_rdp_queue_flush(csp_conn_t * conn) {

	if (conn == NULL) {
		csp_queue_empty(tx_queue);
		csp_queue_empty(rx_queue);
	} else {
		(void)__csp_rdp_queue_flush(tx_queue, conn);
		(void)__csp_rdp_queue_flush(rx_queue, conn);
	}
}